

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hpp
# Opt level: O0

Adjacency_Graph<false> *
Disa::create_graph_structured<false>
          (Adjacency_Graph<false> *__return_storage_ptr__,size_t number_vertices)

{
  unsigned_long local_a8;
  pair<unsigned_long,_unsigned_long> local_a0;
  unsigned_long local_90;
  pair<unsigned_long,_unsigned_long> local_88;
  unsigned_long local_78;
  pair<unsigned_long,_unsigned_long> local_70 [2];
  unsigned_long local_50;
  pair<unsigned_long,_unsigned_long> local_48;
  unsigned_long local_38;
  size_t i_vertex;
  size_t i_x;
  size_t i_y;
  size_t local_18;
  size_t number_vertices_local;
  Adjacency_Graph<false> *structured;
  
  i_y._7_1_ = 0;
  local_18 = number_vertices;
  number_vertices_local = (size_t)__return_storage_ptr__;
  Adjacency_Graph<false>::Adjacency_Graph(__return_storage_ptr__);
  for (i_x = 0; i_x < local_18; i_x = i_x + 1) {
    for (i_vertex = 0; i_vertex < local_18; i_vertex = i_vertex + 1) {
      local_38 = i_x * local_18 + i_vertex;
      if (i_vertex != 0) {
        local_50 = local_38 - 1;
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_true>
                  (&local_48,&local_50,&local_38);
        Adjacency_Graph<false>::insert(__return_storage_ptr__,&local_48);
      }
      if (i_vertex != local_18 - 1) {
        local_78 = local_38 + 1;
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_true>
                  (local_70,&local_38,&local_78);
        Adjacency_Graph<false>::insert(__return_storage_ptr__,local_70);
      }
      if (i_x != 0) {
        local_90 = local_38 - local_18;
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_true>
                  (&local_88,&local_90,&local_38);
        Adjacency_Graph<false>::insert(__return_storage_ptr__,&local_88);
      }
      if (i_x < local_18 - 1) {
        local_a8 = local_38 + local_18;
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_true>
                  (&local_a0,&local_38,&local_a8);
        Adjacency_Graph<false>::insert(__return_storage_ptr__,&local_a0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Adjacency_Graph<_directed> create_graph_structured(std::size_t number_vertices) {
  Adjacency_Graph<_directed> structured;
  for(std::size_t i_y = 0; i_y < number_vertices; ++i_y) {
    for(std::size_t i_x = 0; i_x < number_vertices; ++i_x) {
      const std::size_t i_vertex = i_y * (number_vertices) + i_x;
      if(!_directed && i_x != 0) structured.insert({i_vertex - 1, i_vertex});
      if(i_x != number_vertices - 1) structured.insert({i_vertex, i_vertex + 1});
      if(!_directed && i_y != 0) structured.insert({i_vertex - number_vertices, i_vertex});
      if(i_y < number_vertices - 1) structured.insert({i_vertex, i_vertex + number_vertices});
    }
  }
  return structured;
}